

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.cpp
# Opt level: O1

void boost::detail::(anonymous_namespace)::tls_destructor(void *data)

{
  thread_exit_callback_node *ptVar1;
  const_iterator __position;
  thread_exit_callback_node *current_node;
  thread_data_ptr thread_info;
  enable_shared_from_this<boost::detail::thread_data_base> local_28;
  element_type *local_18;
  shared_count sStack_10;
  
  enable_shared_from_this<boost::detail::thread_data_base>::shared_from_this(&local_28);
  if (local_28.weak_this_.px == (element_type *)0x0) {
LAB_0019d850:
    shared_count::~shared_count((shared_count *)&local_28.weak_this_.pn);
    return;
  }
  do {
    if (local_28.weak_this_.px == (element_type *)0x0) {
LAB_0019d860:
      __assert_fail("px != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Sleeplessy[P]ccel/third_party/boost/boost/smart_ptr/shared_ptr.hpp"
                    ,0x2de,
                    "typename boost::detail::sp_member_access<T>::type boost::shared_ptr<boost::detail::thread_data_base>::operator->() const [T = boost::detail::thread_data_base]"
                   );
    }
    if ((((local_28.weak_this_.px)->tss_data)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)
       && ((local_28.weak_this_.px)->thread_exit_callbacks == (thread_exit_callback_node *)0x0)) {
      local_18 = ((local_28.weak_this_.px)->self).px;
      sStack_10.pi_ = ((local_28.weak_this_.px)->self).pn.pi_;
      ((local_28.weak_this_.px)->self).px = (element_type *)0x0;
      ((local_28.weak_this_.px)->self).pn.pi_ = (sp_counted_base *)0x0;
      shared_count::~shared_count(&sStack_10);
      goto LAB_0019d850;
    }
    while( true ) {
      if (local_28.weak_this_.px == (element_type *)0x0) goto LAB_0019d860;
      ptVar1 = (local_28.weak_this_.px)->thread_exit_callbacks;
      if (ptVar1 == (thread_exit_callback_node *)0x0) break;
      (local_28.weak_this_.px)->thread_exit_callbacks = ptVar1->next;
      if (ptVar1->func != (thread_exit_function_base *)0x0) {
        (**(code **)(*(long *)ptVar1->func + 0x10))();
        if (ptVar1->func != (thread_exit_function_base *)0x0) {
          (**(code **)(*(long *)ptVar1->func + 8))();
        }
      }
      operator_delete(ptVar1,0x10);
    }
    while( true ) {
      if (local_28.weak_this_.px == (element_type *)0x0) goto LAB_0019d860;
      if (((local_28.weak_this_.px)->tss_data)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0
         ) break;
      __position._M_node =
           ((local_28.weak_this_.px)->tss_data)._M_t._M_impl.super__Rb_tree_header._M_header._M_left
      ;
      if ((__position._M_node[1]._M_parent != (_Base_ptr)0x0) &&
         (__position._M_node[1]._M_right != (_Base_ptr)0x0)) {
        (**(code **)(*(long *)__position._M_node[1]._M_parent + 0x10))();
      }
      if (local_28.weak_this_.px == (element_type *)0x0) goto LAB_0019d860;
      std::
      _Rb_tree<const_void_*,_std::pair<const_void_*const,_boost::detail::tss_data_node>,_std::_Select1st<std::pair<const_void_*const,_boost::detail::tss_data_node>_>,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_boost::detail::tss_data_node>_>_>
      ::_M_erase_aux(&((local_28.weak_this_.px)->tss_data)._M_t,__position);
    }
  } while( true );
}

Assistant:

static void tls_destructor(void* data)
                {
                    //boost::detail::thread_data_base* thread_info=static_cast<boost::detail::thread_data_base*>(data);
                    boost::detail::thread_data_ptr thread_info = static_cast<boost::detail::thread_data_base*>(data)->shared_from_this();

                    if(thread_info)
                    {
                        while(!thread_info->tss_data.empty() || thread_info->thread_exit_callbacks)
                        {

                            while(thread_info->thread_exit_callbacks)
                            {
                                detail::thread_exit_callback_node* const current_node=thread_info->thread_exit_callbacks;
                                thread_info->thread_exit_callbacks=current_node->next;
                                if(current_node->func)
                                {
                                    (*current_node->func)();
                                    delete current_node->func;
                                }
                                delete current_node;
                            }
                            while (!thread_info->tss_data.empty())
                            {
                                std::map<void const*,detail::tss_data_node>::iterator current
                                    = thread_info->tss_data.begin();
                                if(current->second.func && (current->second.value!=0))
                                {
                                    (*current->second.func)(current->second.value);
                                }
                                thread_info->tss_data.erase(current);
                            }
                        }
                        thread_info->self.reset();
                    }
                }